

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::ComputeDefaultActions(BaseTag *this,string *type)

{
  pointer piVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  int a;
  ACT_TYPE a_00;
  int s;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  
  bVar2 = std::operator==(type,"MDP");
  if (bVar2) {
    (**(code **)(*(long *)this + 0x30))(this);
    uVar3 = (**(code **)(*(long *)this + 0x10))(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)(int)uVar3);
    lVar8 = *(long *)&this->field_0x8;
    piVar1 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = 0;
    uVar9 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar9 = uVar7;
    }
    for (; uVar9 * 4 != uVar7; uVar7 = uVar7 + 4) {
      *(undefined4 *)((long)piVar1 + uVar7) = *(undefined4 *)(lVar8 + uVar7 * 4);
    }
  }
  else {
    bVar2 = std::operator==(type,"SP");
    if (!bVar2) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
      poVar6 = std::operator<<(poVar6,(string *)type);
      std::endl<char,std::char_traits<char>>(poVar6);
      exit(1);
    }
    iVar4 = (**(code **)(*(long *)this + 0x10))(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)iVar4);
    iVar4 = (int)this + 0x58;
    lVar8 = 0;
    while( true ) {
      iVar5 = (**(code **)(*(long *)this + 0x10))(this);
      if (iVar5 <= lVar8) break;
      piVar1 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar1[lVar8] = 0;
      iVar5 = (this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar8];
      if (iVar5 == (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar8]) {
        piVar1[lVar8] = 4;
      }
      else {
        dVar10 = (double)despot::Floor::Distance(iVar4,iVar5);
        for (a_00 = 0; a_00 != 4; a_00 = a_00 + 1) {
          iVar5 = NextRobPosition(this,(this->rob_).super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_start[lVar8],a_00);
          dVar11 = (double)despot::Floor::Distance(iVar4,iVar5);
          if (dVar11 < dVar10) {
            (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar8] = a_00;
            break;
          }
        }
      }
      lVar8 = lVar8 + 1;
    }
  }
  return;
}

Assistant:

void BaseTag::ComputeDefaultActions(string type) const {
	if (type == "MDP") {
		const_cast<BaseTag*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);

		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
		}
	} else if (type == "SP") {
		// Follow the shortest path from the robot to the opponent
		default_action_.resize(NumStates());
		for (int s = 0; s < NumStates(); s++) {
			default_action_[s] = 0;
			if (rob_[s] == opp_[s]) {
				default_action_[s] = TagAction();
			} else {
				double cur_dist = floor_.Distance(rob_[s], opp_[s]);
				for (int a = 0; a < 4; a++) {
					int next = NextRobPosition(rob_[s], a);
					double dist = floor_.Distance(next, opp_[s]);

					if (dist < cur_dist) {
						default_action_[s] = a;
						break;
					}
				}
			}
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(1);
	}
}